

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetDisplayName
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this,int32_t index,
          Locale *localeParam)

{
  int iVar1;
  uint uVar2;
  char *src;
  char16_t *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar4;
  undefined4 uVar5;
  ConstChar16Ptr local_98;
  ConstChar16Ptr local_90;
  char16_t *local_88;
  char16_t *local_78;
  UnicodeString localeName;
  
  if ((index < 0 || this->localizations == (LocalizationInfo *)0x0) ||
     (iVar1 = (*this->localizations->_vptr_LocalizationInfo[3])(), iVar1 <= index)) {
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003d8fe8;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  else {
    src = Locale::getBaseName(localeParam);
    UnicodeString::UnicodeString(&localeName,src,-1,kInvariant);
    uVar5 = localeName.fUnion.fFields.fLength;
    if (-1 < localeName.fUnion.fStackFields.fLengthAndFlags) {
      uVar5 = (int)localeName.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    pcVar3 = UnicodeString::getBuffer(&localeName,uVar5 + 1);
    while (-1 < (int)uVar5) {
      pcVar3[(uint)uVar5] = L'\0';
      uVar2 = (*this->localizations->_vptr_LocalizationInfo[8])(this->localizations,pcVar3);
      uVar4 = uVar5;
      if (-1 < (int)uVar2) {
        iVar1 = (*this->localizations->_vptr_LocalizationInfo[7])
                          (this->localizations,(ulong)uVar2,(ulong)(uint)index);
        local_90.p_ = (char16_t *)CONCAT44(extraout_var_00,iVar1);
        UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_90,-1);
        local_88 = local_90.p_;
        goto LAB_002206e5;
      }
      do {
        uVar5 = uVar4 - 1;
        if (uVar4 < 2) break;
        uVar4 = uVar5;
      } while (pcVar3[(uint)uVar5] != L'_');
      while ((0 < (int)uVar5 && (pcVar3[(ulong)(uint)uVar5 - 1] == L'_'))) {
        uVar5 = uVar5 - 1;
      }
    }
    iVar1 = (*this->localizations->_vptr_LocalizationInfo[4])
                      (this->localizations,(ulong)(uint)index);
    local_98.p_ = (char16_t *)CONCAT44(extraout_var,iVar1);
    UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_98,-1);
    local_78 = local_98.p_;
LAB_002206e5:
    UnicodeString::~UnicodeString(&localeName);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString 
RuleBasedNumberFormat::getRuleSetDisplayName(int32_t index, const Locale& localeParam) {
    if (localizations && index >= 0 && index < localizations->getNumberOfRuleSets()) {
        UnicodeString localeName(localeParam.getBaseName(), -1, UnicodeString::kInvariant); 
        int32_t len = localeName.length();
        UChar* localeStr = localeName.getBuffer(len + 1);
        while (len >= 0) {
            localeStr[len] = 0;
            int32_t ix = localizations->indexForLocale(localeStr);
            if (ix >= 0) {
                UnicodeString name(TRUE, localizations->getDisplayName(ix, index), -1);
                return name;
            }
            
            // trim trailing portion, skipping over ommitted sections
            do { --len;} while (len > 0 && localeStr[len] != 0x005f); // underscore
            while (len > 0 && localeStr[len-1] == 0x005F) --len;
        }
        UnicodeString name(TRUE, localizations->getRuleSetName(index), -1);
        return name;
    }
    UnicodeString bogus;
    bogus.setToBogus();
    return bogus;
}